

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * read_browser_request(uint32_t *size)

{
  uint uVar1;
  ssize_t sVar2;
  char *pcVar3;
  ulong uVar4;
  
  sVar2 = read(0,size,4);
  if (sVar2 < 1) {
    pcVar3 = "Failed to read request size";
  }
  else {
    uVar1 = *size;
    pcVar3 = (char *)malloc((ulong)uVar1);
    if (pcVar3 != (char *)0x0) {
      uVar4 = read(0,pcVar3,(ulong)uVar1);
      if (uVar4 != *size) {
        perror("Failed to read request body");
        free(pcVar3);
        return (char *)0x0;
      }
      return pcVar3;
    }
    pcVar3 = "Failed to allocate memory for the text";
  }
  perror(pcVar3);
  return (char *)0x0;
}

Assistant:

char *
read_browser_request (uint32_t *size)
{
  char *text = NULL;

  /* First 4 bytes is the message type */
  if (read (STDIN_FILENO, (char *) size, 4) <= 0)
    {
      perror ("Failed to read request size");
      return text;
    }

  if (unlikely ((text = malloc (*size)) == NULL))
    {
      perror("Failed to allocate memory for the text");
      return text;
    }

  if (read (STDIN_FILENO, text, *size) != *size)
    {
      perror ("Failed to read request body");
      free (text);
      return NULL;
    }

  return text;
}